

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O0

void __thiscall libtorrent::aux::peer_list::update_connect_candidates(peer_list *this,int delta)

{
  int delta_local;
  peer_list *this_local;
  
  if (((delta != 0) &&
      (this->m_num_connect_candidates = delta + this->m_num_connect_candidates, delta < 0)) &&
     (this->m_num_connect_candidates < 0)) {
    this->m_num_connect_candidates = 0;
  }
  return;
}

Assistant:

void peer_list::update_connect_candidates(int delta)
	{
		TORRENT_ASSERT(is_single_thread());
		if (delta == 0) return;
		m_num_connect_candidates += delta;
		if (delta < 0)
		{
			TORRENT_ASSERT(m_num_connect_candidates >= 0);
			if (m_num_connect_candidates < 0) m_num_connect_candidates = 0;
		}
	}